

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

int secp256k1_ecmult_pippenger_batch
              (secp256k1_callback *error_callback,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,
              size_t n_points,size_t cb_offset)

{
  long lVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  size_t checkpoint;
  secp256k1_ge *p1;
  secp256k1_scalar *s1;
  long *plVar8;
  void *pvVar9;
  ulong uVar10;
  secp256k1_gej *b;
  long lVar11;
  secp256k1_gej *b_00;
  secp256k1_scalar *s1_00;
  long lVar12;
  uint uVar13;
  secp256k1_ge *psVar14;
  secp256k1_ge *psVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  byte bVar20;
  long local_138;
  secp256k1_gej running_sum;
  
  bVar20 = 0;
  checkpoint = secp256k1_scratch_checkpoint(error_callback,scratch);
  secp256k1_gej_set_infinity(r);
  iVar7 = 1;
  if (inp_g_sc != (secp256k1_scalar *)0x0 || n_points != 0) {
    lVar11 = n_points * 2 + 2;
    uVar6 = secp256k1_pippenger_bucket_window(n_points);
    p1 = (secp256k1_ge *)secp256k1_scratch_alloc(error_callback,scratch,lVar11 * 0x68);
    s1 = (secp256k1_scalar *)secp256k1_scratch_alloc(error_callback,scratch,lVar11 * 0x20);
    plVar8 = (long *)secp256k1_scratch_alloc(error_callback,scratch,0x10);
    if ((plVar8 != (long *)0x0 && s1 != (secp256k1_scalar *)0x0) && p1 != (secp256k1_ge *)0x0) {
      pvVar9 = secp256k1_scratch_alloc(error_callback,scratch,lVar11 * 0x10);
      plVar8[1] = (long)pvVar9;
      bVar5 = 0x7f / (byte)(uVar6 + 1);
      uVar13 = (uint)bVar5;
      uVar10 = (ulong)(bVar5 + 1);
      pvVar9 = secp256k1_scratch_alloc(error_callback,scratch,lVar11 * uVar10 * 4);
      *plVar8 = (long)pvVar9;
      b = (secp256k1_gej *)
          secp256k1_scratch_alloc(error_callback,scratch,0x98L << ((byte)uVar6 & 0x3f));
      if ((plVar8[1] != 0) && (b != (secp256k1_gej *)0x0 && *plVar8 != 0)) {
        if (inp_g_sc == (secp256k1_scalar *)0x0) {
          lVar11 = 0;
        }
        else {
          uVar2 = inp_g_sc->d[0];
          uVar3 = inp_g_sc->d[1];
          uVar4 = inp_g_sc->d[3];
          s1->d[2] = inp_g_sc->d[2];
          s1->d[3] = uVar4;
          s1->d[0] = uVar2;
          s1->d[1] = uVar3;
          psVar14 = &secp256k1_ge_const_g;
          psVar15 = p1;
          for (lVar11 = 0xd; lVar11 != 0; lVar11 = lVar11 + -1) {
            (psVar15->x).n[0] = (psVar14->x).n[0];
            psVar14 = (secp256k1_ge *)((long)psVar14 + ((ulong)bVar20 * -2 + 1) * 8);
            psVar15 = (secp256k1_ge *)((long)psVar15 + (ulong)bVar20 * -0x10 + 8);
          }
          secp256k1_ecmult_endo_split(s1,s1 + 1,p1,p1 + 1);
          lVar11 = 2;
        }
        s1_00 = (secp256k1_scalar *)((long)s1->d + (ulong)(uint)((int)lVar11 << 5));
        psVar14 = p1 + lVar11;
        do {
          bVar19 = n_points == 0;
          n_points = n_points - 1;
          if (bVar19) {
            local_138 = 0;
            psVar14 = p1;
            for (lVar12 = 0; lVar11 != lVar12; lVar12 = lVar12 + 1) {
              iVar7 = secp256k1_scalar_is_zero(s1);
              if ((iVar7 == 0) && (iVar7 = secp256k1_ge_is_infinity(psVar14), iVar7 == 0)) {
                *(long *)(plVar8[1] + 8 + local_138 * 0x10) = lVar12;
                iVar7 = secp256k1_wnaf_fixed((int *)(local_138 * uVar10 * 4 + *plVar8),s1,uVar6 + 1)
                ;
                *(int *)(plVar8[1] + local_138 * 0x10) = iVar7;
                local_138 = local_138 + 1;
              }
              psVar14 = psVar14 + 1;
              s1 = s1 + 1;
            }
            secp256k1_gej_set_infinity(r);
            if (local_138 != 0) {
              lVar11 = 1L << ((byte)uVar6 & 0x3f);
              for (; -1 < (int)uVar13; uVar13 = uVar13 - 1) {
                for (lVar12 = 0; lVar11 * 0x98 != lVar12; lVar12 = lVar12 + 0x98) {
                  secp256k1_gej_set_infinity((secp256k1_gej *)((long)(b->x).n + lVar12));
                }
                lVar18 = (ulong)uVar13 << 2;
                lVar12 = 8;
                lVar17 = local_138;
                while (bVar19 = lVar17 != 0, lVar17 = lVar17 + -1, uVar16 = uVar6, bVar19) {
                  uVar16 = *(uint *)(*plVar8 + lVar18);
                  lVar1 = *(long *)(plVar8[1] + lVar12);
                  if ((uVar13 == 0) && (*(int *)(plVar8[1] + -8 + lVar12) != 0)) {
                    secp256k1_ge_neg((secp256k1_ge *)&running_sum,p1 + lVar1);
                    secp256k1_gej_add_ge_var(b,b,(secp256k1_ge *)&running_sum,(secp256k1_fe *)0x0);
                  }
                  if ((int)uVar16 < 1) {
                    if ((int)uVar16 < 0) {
                      uVar16 = ~uVar16;
                      secp256k1_ge_neg((secp256k1_ge *)&running_sum,p1 + lVar1);
                      b_00 = &running_sum;
                      goto LAB_00137ae9;
                    }
                  }
                  else {
                    uVar16 = uVar16 - 1;
                    b_00 = (secp256k1_gej *)(p1 + lVar1);
LAB_00137ae9:
                    secp256k1_gej_add_ge_var
                              (b + (uVar16 >> 1),b + (uVar16 >> 1),(secp256k1_ge *)b_00,
                               (secp256k1_fe *)0x0);
                  }
                  lVar12 = lVar12 + 0x10;
                  lVar18 = lVar18 + (0x7f / ((ulong)uVar6 + 1)) * 4 + 4;
                }
                while (uVar16 != 0) {
                  secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
                  uVar16 = uVar16 - 1;
                }
                secp256k1_gej_set_infinity(&running_sum);
                lVar12 = lVar11;
                while (1 < lVar12) {
                  lVar12 = lVar12 + -1;
                  secp256k1_gej_add_var
                            (&running_sum,&running_sum,b + ((uint)lVar12 & 0x7fffffff),
                             (secp256k1_fe *)0x0);
                  secp256k1_gej_add_var(r,r,&running_sum,(secp256k1_fe *)0x0);
                }
                secp256k1_gej_add_var(&running_sum,&running_sum,b,(secp256k1_fe *)0x0);
                secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
                secp256k1_gej_add_var(r,r,&running_sum,(secp256k1_fe *)0x0);
              }
            }
            secp256k1_scratch_apply_checkpoint(error_callback,scratch,checkpoint);
            return 1;
          }
          iVar7 = (*cb)(s1_00,psVar14,cb_offset,cbdata);
          if (iVar7 == 0) break;
          secp256k1_ecmult_endo_split(s1_00,s1_00 + 1,psVar14,psVar14 + 1);
          lVar11 = lVar11 + 2;
          s1_00 = s1_00 + 2;
          psVar14 = psVar14 + 2;
          cb_offset = cb_offset + 1;
        } while( true );
      }
    }
    secp256k1_scratch_apply_checkpoint(error_callback,scratch,checkpoint);
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int secp256k1_ecmult_pippenger_batch(const secp256k1_callback* error_callback, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n_points, size_t cb_offset) {
    const size_t scratch_checkpoint = secp256k1_scratch_checkpoint(error_callback, scratch);
    /* Use 2(n+1) with the endomorphism, when calculating batch
     * sizes. The reason for +1 is that we add the G scalar to the list of
     * other scalars. */
    size_t entries = 2*n_points + 2;
    secp256k1_ge *points;
    secp256k1_scalar *scalars;
    secp256k1_gej *buckets;
    struct secp256k1_pippenger_state *state_space;
    size_t idx = 0;
    size_t point_idx = 0;
    int bucket_window;

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n_points == 0) {
        return 1;
    }
    bucket_window = secp256k1_pippenger_bucket_window(n_points);

    /* We allocate PIPPENGER_SCRATCH_OBJECTS objects on the scratch space. If
     * these allocations change, make sure to update the
     * PIPPENGER_SCRATCH_OBJECTS constant and pippenger_scratch_size
     * accordingly. */
    points = (secp256k1_ge *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*points));
    scalars = (secp256k1_scalar *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*scalars));
    state_space = (struct secp256k1_pippenger_state *) secp256k1_scratch_alloc(error_callback, scratch, sizeof(*state_space));
    if (points == NULL || scalars == NULL || state_space == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }
    state_space->ps = (struct secp256k1_pippenger_point_state *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*state_space->ps));
    state_space->wnaf_na = (int *) secp256k1_scratch_alloc(error_callback, scratch, entries*(WNAF_SIZE(bucket_window+1)) * sizeof(int));
    buckets = (secp256k1_gej *) secp256k1_scratch_alloc(error_callback, scratch, ((size_t)1 << bucket_window) * sizeof(*buckets));
    if (state_space->ps == NULL || state_space->wnaf_na == NULL || buckets == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }

    if (inp_g_sc != NULL) {
        scalars[0] = *inp_g_sc;
        points[0] = secp256k1_ge_const_g;
        idx++;
        secp256k1_ecmult_endo_split(&scalars[0], &scalars[1], &points[0], &points[1]);
        idx++;
    }

    while (point_idx < n_points) {
        if (!cb(&scalars[idx], &points[idx], point_idx + cb_offset, cbdata)) {
            secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
            return 0;
        }
        idx++;
        secp256k1_ecmult_endo_split(&scalars[idx - 1], &scalars[idx], &points[idx - 1], &points[idx]);
        idx++;
        point_idx++;
    }

    secp256k1_ecmult_pippenger_wnaf(buckets, bucket_window, state_space, r, scalars, points, idx);
    secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
    return 1;
}